

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minheap-internal.h
# Opt level: O0

void min_heap_shift_up_unconditional_(min_heap_t *s,uint hole_index,event *e)

{
  event *peVar1;
  bool bVar2;
  uint uVar3;
  uint local_24;
  uint parent;
  event *e_local;
  uint hole_index_local;
  min_heap_t *s_local;
  
  uVar3 = hole_index - 1 >> 1;
  e_local._4_4_ = hole_index;
  do {
    local_24 = uVar3;
    peVar1 = s->p[local_24];
    s->p[e_local._4_4_] = peVar1;
    (peVar1->ev_timeout_pos).min_heap_idx = e_local._4_4_;
    e_local._4_4_ = local_24;
    uVar3 = local_24 - 1 >> 1;
    bVar2 = false;
    if (local_24 != 0) {
      if ((s->p[uVar3]->ev_timeout).tv_sec == (e->ev_timeout).tv_sec) {
        bVar2 = (e->ev_timeout).tv_usec < (s->p[uVar3]->ev_timeout).tv_usec;
      }
      else {
        bVar2 = (e->ev_timeout).tv_sec < (s->p[uVar3]->ev_timeout).tv_sec;
      }
    }
  } while (bVar2);
  s->p[local_24] = e;
  (e->ev_timeout_pos).min_heap_idx = local_24;
  return;
}

Assistant:

void min_heap_shift_up_unconditional_(min_heap_t* s, unsigned hole_index, struct event* e)
{
    unsigned parent = (hole_index - 1) / 2;
    do
    {
	(s->p[hole_index] = s->p[parent])->ev_timeout_pos.min_heap_idx = hole_index;
	hole_index = parent;
	parent = (hole_index - 1) / 2;
    } while (hole_index && min_heap_elem_greater(s->p[parent], e));
    (s->p[hole_index] = e)->ev_timeout_pos.min_heap_idx = hole_index;
}